

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::SharedMemoryArbiterImpl::BindToProducerEndpoint
          (SharedMemoryArbiterImpl *this,ProducerEndpoint *producer_endpoint,TaskRunner *task_runner
          )

{
  mutex *__mutex;
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  char *pcVar5;
  uint *puVar6;
  char *pcVar7;
  function<void_()> flush_callback;
  function<void_()> local_68;
  function<void_()> local_48;
  
  flush_callback.super__Function_base._M_manager = (_Manager_type)0x0;
  flush_callback._M_invoker = (_Invoker_type)0x0;
  flush_callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  flush_callback.super__Function_base._M_functor._8_8_ = 0;
  __mutex = &this->lock_;
  ::std::mutex::lock((mutex *)__mutex);
  if (this->fully_bound_ == true) {
    pcVar5 = base::Basename(
                           "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                           );
    puVar6 = (uint *)__errno_location();
    uVar1 = *puVar6;
    pcVar7 = strerror(uVar1);
    base::LogMessage(kLogError,pcVar5,0x97d4,"%s (errno: %d, %s)","PERFETTO_CHECK(!fully_bound_)",
                     (ulong)uVar1,pcVar7);
  }
  else if (this->task_runner_ == (TaskRunner *)0x0 &&
           this->producer_endpoint_ == (ProducerEndpoint *)0x0) {
    this->producer_endpoint_ = producer_endpoint;
    this->task_runner_ = task_runner;
    base::WeakPtrFactory<perfetto::SharedMemoryArbiterImpl>::Reset(&this->weak_ptr_factory_,this);
    p_Var4 = (this->pending_writers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      if ((_Rb_tree_header *)p_Var4 == &(this->pending_writers_)._M_t._M_impl.super__Rb_tree_header)
      {
        bVar3 = UpdateFullyBoundLocked(this);
        if (bVar3) {
          TakePendingFlushCallbacksLocked(&local_48,this);
          std::function<void_()>::operator=(&flush_callback,&local_48);
          ::std::_Function_base::~_Function_base((_Function_base *)&local_48);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          ::std::function<void_()>::function(&local_68,(function<void_()> *)&flush_callback);
          (*(this->super_SharedMemoryArbiter)._vptr_SharedMemoryArbiter[0xb])(this,&local_68);
          ::std::_Function_base::~_Function_base(&local_68.super__Function_base);
        }
        else {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        ::std::_Function_base::~_Function_base((_Function_base *)&flush_callback);
        return;
      }
      if (*(uint *)&p_Var4[1].field_0x4 < 0x10000) break;
      p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4);
    }
    pcVar5 = base::Basename(
                           "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                           );
    puVar6 = (uint *)__errno_location();
    uVar1 = *puVar6;
    pcVar7 = strerror(uVar1);
    base::LogMessage(kLogError,pcVar5,0x97e3,"%s (errno: %d, %s)",
                     "PERFETTO_CHECK(IsReservationTargetBufferId(entry.second))",(ulong)uVar1,pcVar7
                    );
  }
  else {
    pcVar5 = base::Basename(
                           "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                           );
    puVar6 = (uint *)__errno_location();
    uVar1 = *puVar6;
    pcVar7 = strerror(uVar1);
    base::LogMessage(kLogError,pcVar5,0x97d5,"%s (errno: %d, %s)",
                     "PERFETTO_CHECK(!producer_endpoint_ && !task_runner_)",(ulong)uVar1,pcVar7);
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void SharedMemoryArbiterImpl::BindToProducerEndpoint(
    TracingService::ProducerEndpoint* producer_endpoint,
    base::TaskRunner* task_runner) {
  PERFETTO_DCHECK(producer_endpoint && task_runner);
  PERFETTO_DCHECK(task_runner->RunsTasksOnCurrentThread());

  bool should_flush = false;
  std::function<void()> flush_callback;
  {
    std::lock_guard<std::mutex> scoped_lock(lock_);
    PERFETTO_CHECK(!fully_bound_);
    PERFETTO_CHECK(!producer_endpoint_ && !task_runner_);

    producer_endpoint_ = producer_endpoint;
    task_runner_ = task_runner;

    // Now that we're bound to a task runner, also reset the WeakPtrFactory to
    // it. Because this code runs on the task runner, the factory's weak
    // pointers will be valid on it.
    weak_ptr_factory_.Reset(this);

    // All writers registered so far should be startup trace writers, since
    // the producer cannot feasibly know the target buffer for any future
    // session yet.
    for (const auto& entry : pending_writers_) {
      PERFETTO_CHECK(IsReservationTargetBufferId(entry.second));
    }

    // If all buffer reservations are bound, we can flush pending commits.
    if (UpdateFullyBoundLocked()) {
      should_flush = true;
      flush_callback = TakePendingFlushCallbacksLocked();
    }
  }  // scoped_lock

  // Attempt to flush any pending commits (and run pending flush callbacks). If
  // there are none, this will have no effect. If we ended up in a race that
  // changed |fully_bound_| back to false, the commit will happen once we become
  // |fully_bound_| again.
  if (should_flush)
    FlushPendingCommitDataRequests(flush_callback);
}